

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void __thiscall wallet::WalletInit::AddWalletOptions(WalletInit *this,ArgsManager *argsman)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  char *in_RSI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff558;
  OutputType in_stack_fffffffffffff564;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff590;
  allocator<char> *in_stack_fffffffffffff598;
  allocator<char> *__a;
  ArgsManager *in_stack_fffffffffffff5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  CAmount in_stack_fffffffffffff5b0;
  OptionsCategory *in_stack_fffffffffffff5d8;
  OptionsCategory *cat;
  undefined8 in_stack_fffffffffffff5e0;
  uint uVar2;
  undefined1 *puVar1;
  string *in_stack_fffffffffffff5e8;
  string *help;
  string *in_stack_fffffffffffff5f0;
  string *name;
  ArgsManager *in_stack_fffffffffffff5f8;
  ArgsManager *this_01;
  allocator<char> local_805;
  undefined4 local_804;
  undefined1 local_7fd [7];
  allocator<char> local_7f6;
  undefined1 local_7f5;
  undefined1 local_7f4 [2];
  allocator<char> local_7f2;
  allocator<char> local_7f1 [29];
  undefined4 local_7d4;
  allocator<char> local_7cd;
  undefined4 local_7cc;
  allocator<char> local_7c6;
  allocator<char> local_7c5;
  undefined4 local_7c4;
  allocator<char> local_7be;
  allocator<char> local_7bd;
  undefined4 local_7bc;
  allocator<char> local_7b5;
  undefined4 local_7b4;
  allocator<char> local_7ae;
  allocator<char> local_7ad;
  undefined4 local_7ac;
  allocator<char> local_7a5;
  undefined4 local_7a4;
  allocator<char> local_79d;
  undefined4 local_79c;
  allocator<char> local_796;
  allocator<char> local_795;
  undefined4 local_794;
  allocator<char> local_781;
  undefined4 local_780;
  allocator<char> local_779;
  undefined4 local_778;
  allocator<char> local_771;
  undefined4 local_770;
  allocator<char> local_769;
  undefined4 local_768;
  allocator<char> local_761;
  undefined4 local_760;
  allocator<char> local_759;
  undefined4 local_758;
  allocator<char> local_751;
  undefined4 local_750;
  allocator<char> local_74a;
  allocator<char> local_749;
  undefined4 local_748;
  allocator<char> local_741;
  undefined4 local_740;
  allocator<char> local_73a;
  allocator<char> local_739;
  undefined4 local_738;
  allocator<char> local_731;
  undefined4 local_730;
  allocator<char> local_729 [193];
  OptionsCategory local_668 [16];
  undefined1 local_628 [64];
  OptionsCategory local_5e8 [376];
  long local_8;
  
  uVar2 = (uint)((ulong)in_stack_fffffffffffff5e0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  FormatOutputType_abi_cxx11_(in_stack_fffffffffffff564);
  tinyformat::format<std::__cxx11::string>
            ((char *)in_stack_fffffffffffff588,in_stack_fffffffffffff580);
  local_730 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(local_729);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  tinyformat::format<bool>((char *)in_stack_fffffffffffff588,(bool *)in_stack_fffffffffffff580);
  local_738 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_731);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  local_740 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_73a);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_739);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  FormatMoney_abi_cxx11_(in_stack_fffffffffffff5b0);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  local_748 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  local_750 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_74a);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  FormatMoney_abi_cxx11_(in_stack_fffffffffffff5b0);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  local_758 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_751);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  FormatMoney_abi_cxx11_(in_stack_fffffffffffff5b0);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  local_760 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_759);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  tinyformat::format<unsigned_int>
            ((char *)in_stack_fffffffffffff588,(uint *)in_stack_fffffffffffff580);
  local_768 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_761);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  FormatMoney_abi_cxx11_(in_stack_fffffffffffff5b0);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  local_770 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  FormatMoney_abi_cxx11_(in_stack_fffffffffffff5b0);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  local_778 = 5;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  FormatMoney_abi_cxx11_(in_stack_fffffffffffff5b0);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  local_780 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  CFeeRate::CFeeRate<long>((CFeeRate *)in_stack_fffffffffffff558,0x865259);
  CFeeRate::GetFeePerK((CFeeRate *)in_stack_fffffffffffff558);
  FormatMoney_abi_cxx11_(in_stack_fffffffffffff5b0);
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((char *)in_stack_fffffffffffff598,in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  local_794 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  local_79c = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_796);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_795);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  tinyformat::format<bool>((char *)in_stack_fffffffffffff588,(bool *)in_stack_fffffffffffff580);
  local_7a4 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_79d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  tinyformat::format<unsigned_int>
            ((char *)in_stack_fffffffffffff588,(uint *)in_stack_fffffffffffff580);
  local_7ac = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_7a5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  local_7b4 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_7ae);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_7ad);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  tinyformat::format<bool>((char *)in_stack_fffffffffffff588,(bool *)in_stack_fffffffffffff580);
  local_7bc = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_7b5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  local_7c4 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_7be);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_7bd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  local_7cc = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_7c6);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_7c5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  tinyformat::format<bool>((char *)in_stack_fffffffffffff588,(bool *)in_stack_fffffffffffff580);
  local_7d4 = 2;
  ArgsManager::AddArg(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                      uVar2,in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_7cd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  this_01 = (ArgsManager *)local_628;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  help = (string *)(local_628 + 0x20);
  name = (string *)local_7f4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  puVar1 = &local_7f5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff558);
  __l._M_len = (size_type)in_stack_fffffffffffff5a8;
  __l._M_array = (iterator)in_stack_fffffffffffff5a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff598,__l,(allocator_type *)in_stack_fffffffffffff590);
  ArgsManager::AddHiddenArgs
            (in_stack_fffffffffffff5a0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff598);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffff568);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffff558);
  cat = local_5e8;
  do {
    cat = cat + -8;
    std::__cxx11::string::~string(in_stack_fffffffffffff558);
    uVar2 = (uint)((ulong)puVar1 >> 0x20);
  } while (cat != local_668);
  std::allocator<char>::~allocator((allocator<char> *)local_7f4);
  std::allocator<char>::~allocator((allocator<char> *)(local_7f4 + 1));
  std::allocator<char>::~allocator(&local_7f2);
  std::allocator<char>::~allocator(local_7f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5a8,(char *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  local_7fd._1_4_ = 3;
  ArgsManager::AddArg(this_01,name,help,uVar2,cat);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator((allocator<char> *)(local_7fd + 6));
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_7f6);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7fd;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RSI,in_stack_fffffffffffff598);
  tinyformat::format<bool>((char *)in_stack_fffffffffffff588,(bool *)in_stack_fffffffffffff580);
  local_804 = 3;
  ArgsManager::AddArg(this_01,name,help,uVar2,cat);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator((allocator<char> *)local_7fd);
  __a = &local_805;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RSI,__a);
  tinyformat::format<bool>((char *)in_stack_fffffffffffff588,(bool *)in_stack_fffffffffffff580);
  ArgsManager::AddArg(this_01,name,help,uVar2,cat);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::__cxx11::string::~string(in_stack_fffffffffffff558);
  std::allocator<char>::~allocator(&local_805);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletInit::AddWalletOptions(ArgsManager& argsman) const
{
    argsman.AddArg("-addresstype", strprintf("What type of addresses to use (\"legacy\", \"p2sh-segwit\", \"bech32\", or \"bech32m\", default: \"%s\")", FormatOutputType(DEFAULT_ADDRESS_TYPE)), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-avoidpartialspends", strprintf("Group outputs by address, selecting many (possibly all) or none, instead of selecting on a per-output basis. Privacy is improved as addresses are mostly swept with fewer transactions and outputs are aggregated in clean change addresses. It may result in higher fees due to less optimal coin selection caused by this added limitation and possibly a larger-than-necessary number of inputs being used. Always enabled for wallets with \"avoid_reuse\" enabled, otherwise default: %u.", DEFAULT_AVOIDPARTIALSPENDS), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-changetype",
                   "What type of change to use (\"legacy\", \"p2sh-segwit\", \"bech32\", or \"bech32m\"). Default is \"legacy\" when "
                   "-addresstype=legacy, else it is an implementation detail.",
                   ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-consolidatefeerate=<amt>", strprintf("The maximum feerate (in %s/kvB) at which transaction building may use more inputs than strictly necessary so that the wallet's UTXO pool can be reduced (default: %s).", CURRENCY_UNIT, FormatMoney(DEFAULT_CONSOLIDATE_FEERATE)), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-disablewallet", "Do not load the wallet and disable wallet RPC calls", ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-discardfee=<amt>", strprintf("The fee rate (in %s/kvB) that indicates your tolerance for discarding change by adding it to the fee (default: %s). "
                                                                "Note: An output is discarded if it is dust at this rate, but we will always discard up to the dust relay fee and a discard fee above that is limited by the fee estimate for the longest target",
                                                              CURRENCY_UNIT, FormatMoney(DEFAULT_DISCARD_FEE)), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);

    argsman.AddArg("-fallbackfee=<amt>", strprintf("A fee rate (in %s/kvB) that will be used when fee estimation has insufficient data. 0 to entirely disable the fallbackfee feature. (default: %s)",
                                                               CURRENCY_UNIT, FormatMoney(DEFAULT_FALLBACK_FEE)), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-keypool=<n>", strprintf("Set key pool size to <n> (default: %u). Warning: Smaller sizes may increase the risk of losing funds when restoring from an old backup, if none of the addresses in the original keypool have been used.", DEFAULT_KEYPOOL_SIZE), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-maxapsfee=<n>", strprintf("Spend up to this amount in additional (absolute) fees (in %s) if it allows the use of partial spend avoidance (default: %s)", CURRENCY_UNIT, FormatMoney(DEFAULT_MAX_AVOIDPARTIALSPEND_FEE)), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-maxtxfee=<amt>", strprintf("Maximum total fees (in %s) to use in a single wallet transaction; setting this too low may abort large transactions (default: %s)",
        CURRENCY_UNIT, FormatMoney(DEFAULT_TRANSACTION_MAXFEE)), ArgsManager::ALLOW_ANY, OptionsCategory::DEBUG_TEST);
    argsman.AddArg("-mintxfee=<amt>", strprintf("Fee rates (in %s/kvB) smaller than this are considered zero fee for transaction creation (default: %s)",
                                                            CURRENCY_UNIT, FormatMoney(DEFAULT_TRANSACTION_MINFEE)), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-paytxfee=<amt>", strprintf("Fee rate (in %s/kvB) to add to transactions you send (default: %s)",
                                                            CURRENCY_UNIT, FormatMoney(CFeeRate{DEFAULT_PAY_TX_FEE}.GetFeePerK())), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
#ifdef ENABLE_EXTERNAL_SIGNER
    argsman.AddArg("-signer=<cmd>", "External signing tool, see doc/external-signer.md", ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
#endif
    argsman.AddArg("-spendzeroconfchange", strprintf("Spend unconfirmed change when sending transactions (default: %u)", DEFAULT_SPEND_ZEROCONF_CHANGE), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-txconfirmtarget=<n>", strprintf("If paytxfee is not set, include enough fee so transactions begin confirmation on average within n blocks (default: %u)", DEFAULT_TX_CONFIRM_TARGET), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-wallet=<path>", "Specify wallet path to load at startup. Can be used multiple times to load multiple wallets. Path is to a directory containing wallet data and log files. If the path is not absolute, it is interpreted relative to <walletdir>. This only loads existing wallets and does not create new ones. For backwards compatibility this also accepts names of existing top-level data files in <walletdir>.", ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::WALLET);
    argsman.AddArg("-walletbroadcast",  strprintf("Make the wallet broadcast transactions (default: %u)", DEFAULT_WALLETBROADCAST), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
    argsman.AddArg("-walletdir=<dir>", "Specify directory to hold wallets (default: <datadir>/wallets if it exists, otherwise <datadir>)", ArgsManager::ALLOW_ANY | ArgsManager::NETWORK_ONLY, OptionsCategory::WALLET);
#if HAVE_SYSTEM
    argsman.AddArg("-walletnotify=<cmd>", "Execute command when a wallet transaction changes. %s in cmd is replaced by TxID, %w is replaced by wallet name, %b is replaced by the hash of the block including the transaction (set to 'unconfirmed' if the transaction is not included) and %h is replaced by the block height (-1 if not included). %w is not currently implemented on windows. On systems where %w is supported, it should NOT be quoted because this would break shell escaping used to invoke the command.", ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);
#endif
    argsman.AddArg("-walletrbf", strprintf("Send transactions with full-RBF opt-in enabled (RPC only, default: %u)", DEFAULT_WALLET_RBF), ArgsManager::ALLOW_ANY, OptionsCategory::WALLET);

#ifdef USE_BDB
    argsman.AddArg("-dblogsize=<n>", strprintf("Flush wallet database activity from memory to disk log every <n> megabytes (default: %u)", DatabaseOptions().max_log_mb), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
    argsman.AddArg("-flushwallet", strprintf("Run a thread to flush wallet periodically (default: %u)", DEFAULT_FLUSHWALLET), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
    argsman.AddArg("-privdb", strprintf("Sets the DB_PRIVATE flag in the wallet db environment (default: %u)", !DatabaseOptions().use_shared_memory), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
    argsman.AddArg("-swapbdbendian", "Swaps the internal endianness of BDB wallet databases (default: false)", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
#else
    argsman.AddHiddenArgs({"-dblogsize", "-flushwallet", "-privdb", "-swapbdbendian"});
#endif

#ifdef USE_SQLITE
    argsman.AddArg("-unsafesqlitesync", "Set SQLite synchronous=OFF to disable waiting for the database to sync to disk. This is unsafe and can cause data loss and corruption. This option is only used by tests to improve their performance (default: false)", ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
#else
    argsman.AddHiddenArgs({"-unsafesqlitesync"});
#endif

    argsman.AddArg("-walletrejectlongchains", strprintf("Wallet will not create transactions that violate mempool chain limits (default: %u)", DEFAULT_WALLET_REJECT_LONG_CHAINS), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
    argsman.AddArg("-walletcrosschain", strprintf("Allow reusing wallet files across chains (default: %u)", DEFAULT_WALLETCROSSCHAIN), ArgsManager::ALLOW_ANY | ArgsManager::DEBUG_ONLY, OptionsCategory::WALLET_DEBUG_TEST);
}